

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

LogicalType *
duckdb::LogicalType::Deserialize(LogicalType *__return_storage_ptr__,Deserializer *deserializer)

{
  LogicalTypeId id;
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  string str;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"id");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_58,deserializer);
    id = EnumUtil::FromString<duckdb::LogicalTypeId>((char *)local_58);
    if (local_58 != (element_type *)&stack0xffffffffffffffb8) {
      operator_delete(local_58);
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    id = (LogicalTypeId)iVar1;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"type_info");
  if ((char)iVar1 == '\0') {
    peVar2 = (element_type *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      peVar2 = (element_type *)0x0;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ExtraTypeInfo::Deserialize((ExtraTypeInfo *)&local_58,deserializer);
      p_Var3 = p_Stack_50;
      peVar2 = local_58;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58 = (element_type *)0x0;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  local_38._M_allocated_capacity = (size_type)peVar2;
  local_38._8_8_ = p_Var3;
  LogicalType(__return_storage_ptr__,id,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)&local_38);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::Deserialize(Deserializer &deserializer) {
	auto id = deserializer.ReadProperty<LogicalTypeId>(100, "id");
	auto type_info = deserializer.ReadPropertyWithDefault<shared_ptr<ExtraTypeInfo>>(101, "type_info");
	LogicalType result(id, std::move(type_info));
	return result;
}